

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

aiQuaternion __thiscall
comparer_context::cmp<aiQuaterniont<float>>(comparer_context *this,string *name)

{
  aiQuaternion aVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  float local_58;
  float local_48;
  float local_38;
  float local_28;
  
  std::operator+(&bStack_78,name,".w");
  local_28 = cmp<float>(this,&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::operator+(&bStack_78,name,".x");
  local_38 = cmp<float>(this,&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::operator+(&bStack_78,name,".y");
  local_48 = cmp<float>(this,&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::operator+(&bStack_78,name,".z");
  local_58 = cmp<float>(this,&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  aVar1.z = local_58;
  aVar1.y = local_48;
  aVar1.x = local_38;
  aVar1.w = local_28;
  return aVar1;
}

Assistant:

aiQuaternion comparer_context :: cmp<aiQuaternion >(const std::string& name)
{
    const float w = cmp<float>(name+".w");
    const float x = cmp<float>(name+".x");
    const float y = cmp<float>(name+".y");
    const float z = cmp<float>(name+".z");

    return aiQuaternion(w,x,y,z);
}